

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void helper_swr_mips64el(CPUMIPSState_conflict5 *env,target_ulong arg1,target_ulong arg2,int mem_idx
                        )

{
  uintptr_t unaff_retaddr;
  int mem_idx_local;
  target_ulong arg2_local;
  target_ulong arg1_local;
  CPUMIPSState_conflict5 *env_local;
  
  cpu_stb_mmuidx_ra_mips64el
            ((CPUArchState_conflict13 *)env,arg2,(uint)arg1 & 0xff,mem_idx,unaff_retaddr);
  if ((arg2 & 3) != 3) {
    cpu_stb_mmuidx_ra_mips64el
              ((CPUArchState_conflict13 *)env,arg2 + 1,(uint)(arg1 >> 8) & 0xff,mem_idx,
               unaff_retaddr);
  }
  if (1 < (arg2 & 3 ^ 3)) {
    cpu_stb_mmuidx_ra_mips64el
              ((CPUArchState_conflict13 *)env,arg2 + 2,(uint)(arg1 >> 0x10) & 0xff,mem_idx,
               unaff_retaddr);
  }
  if ((arg2 & 3) == 0) {
    cpu_stb_mmuidx_ra_mips64el
              ((CPUArchState_conflict13 *)env,arg2 + 3,(uint)(arg1 >> 0x18) & 0xff,mem_idx,
               unaff_retaddr);
  }
  return;
}

Assistant:

void helper_swr(CPUMIPSState *env, target_ulong arg1, target_ulong arg2,
                int mem_idx)
{
    cpu_stb_mmuidx_ra(env, arg2, (uint8_t)arg1, mem_idx, GETPC());

    if (GET_LMASK(arg2) >= 1) {
        cpu_stb_mmuidx_ra(env, GET_OFFSET(arg2, -1), (uint8_t)(arg1 >> 8),
                          mem_idx, GETPC());
    }

    if (GET_LMASK(arg2) >= 2) {
        cpu_stb_mmuidx_ra(env, GET_OFFSET(arg2, -2), (uint8_t)(arg1 >> 16),
                          mem_idx, GETPC());
    }

    if (GET_LMASK(arg2) == 3) {
        cpu_stb_mmuidx_ra(env, GET_OFFSET(arg2, -3), (uint8_t)(arg1 >> 24),
                          mem_idx, GETPC());
    }
}